

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_Empty_Test::TestBody(DBTest_Empty_Test *this)

{
  int iVar1;
  internal iVar2;
  undefined8 *puVar3;
  size_type sVar4;
  pointer *__ptr;
  char *message;
  char *in_R9;
  bool bVar5;
  Message local_88;
  undefined8 *local_80;
  string local_78;
  string local_58;
  AssertHelper local_38;
  
  bVar5 = (this->super_DBTest).db_ != (DB *)0x0;
  local_78._M_dataplus._M_p._0_1_ = bVar5;
  if (bVar5) {
    do {
      local_78._M_string_length = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"foo","");
      DBTest::Get(&local_58,&this->super_DBTest,&local_78,(Snapshot *)0x0);
      testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                ((internal *)&local_88,"\"NOT_FOUND\"","Get(\"foo\")",(char (*) [10])"NOT_FOUND",
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      iVar2 = local_88.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_;
      if (local_88.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        message = "";
        if (local_80 != (undefined8 *)0x0) {
          message = (char *)*local_80;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x21f,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
        if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
        }
      }
      puVar3 = local_80;
      if (local_80 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_80 != local_80 + 2) {
          operator_delete((undefined8 *)*local_80);
        }
        operator_delete(puVar3);
      }
      if (iVar2 == (internal)0x0) {
        return;
      }
      iVar1 = (this->super_DBTest).option_config_;
      (this->super_DBTest).option_config_ = iVar1 + 1;
      if (2 < iVar1) {
        return;
      }
      DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
      bVar5 = (this->super_DBTest).db_ != (DB *)0x0;
      local_78._M_dataplus._M_p._0_1_ = bVar5;
    } while (bVar5);
  }
  local_78._M_string_length = 0;
  testing::Message::Message(&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_58,(internal *)&local_78,(AssertionResult *)"db_ != nullptr","false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,0x21e,local_58._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_38,&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((long *)CONCAT71(local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_88.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_88.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  sVar4 = local_78._M_string_length;
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)sVar4);
  }
  return;
}

Assistant:

TEST_F(DBTest, Empty) {
  do {
    ASSERT_TRUE(db_ != nullptr);
    ASSERT_EQ("NOT_FOUND", Get("foo"));
  } while (ChangeOptions());
}